

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.cpp
# Opt level: O0

void __thiscall jrtplib::RTCPCompoundPacket::~RTCPCompoundPacket(RTCPCompoundPacket *this)

{
  uint8_t *buf;
  RTPMemoryManager *mgr;
  RTCPCompoundPacket *this_local;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPCompoundPacket_00192778;
  ClearPacketList(this);
  if ((this->compoundpacket != (uint8_t *)0x0) && ((this->deletepacket & 1U) != 0)) {
    buf = this->compoundpacket;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDeleteByteArray(buf,mgr);
  }
  std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::~list
            (&this->rtcppacklist);
  RTPMemoryObject::~RTPMemoryObject(&this->super_RTPMemoryObject);
  return;
}

Assistant:

RTCPCompoundPacket::~RTCPCompoundPacket()
{
	ClearPacketList();
	if (compoundpacket && deletepacket)
		RTPDeleteByteArray(compoundpacket,GetMemoryManager());
}